

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 uVar5;
  undefined1 local_48 [8];
  ParsedInternalKey parsed_key;
  Saver *s;
  Slice *v_local;
  Slice *ikey_local;
  void *arg_local;
  
  parsed_key._24_8_ = arg;
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)local_48);
  bVar2 = ParseInternalKey(ikey,(ParsedInternalKey *)local_48);
  if (bVar2) {
    iVar3 = (**(code **)(**(long **)(parsed_key._24_8_ + 8) + 0x10))
                      (*(long **)(parsed_key._24_8_ + 8),local_48,parsed_key._24_8_ + 0x10);
    if (iVar3 == 0) {
      uVar5 = 2;
      if ((int)parsed_key.sequence == 1) {
        uVar5 = 1;
      }
      *(undefined4 *)parsed_key._24_8_ = uVar5;
      if (*(int *)parsed_key._24_8_ == 1) {
        pcVar1 = *(char **)(parsed_key._24_8_ + 0x20);
        pcVar4 = Slice::data(v);
        Slice::size(v);
        std::__cxx11::string::assign(pcVar1,(ulong)pcVar4);
      }
    }
  }
  else {
    *(undefined4 *)parsed_key._24_8_ = 3;
  }
  return;
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}